

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  ulong *puVar1;
  int iVar2;
  short sVar3;
  char cVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  uint uVar17;
  BYTE *e_3;
  long lVar18;
  ushort uVar19;
  long *plVar20;
  int *piVar21;
  int iVar22;
  ulong *puVar23;
  char cVar24;
  int iVar25;
  long *plVar26;
  long lVar27;
  short *psVar28;
  uint uVar29;
  char *pcVar30;
  BYTE *e_1;
  short *psVar31;
  BYTE *s;
  ulong *puVar32;
  BYTE *s_3;
  BYTE *e;
  long *plVar33;
  short *psVar34;
  BYTE *e_2;
  ulong *puVar35;
  short *local_b0;
  short *local_a8;
  U16 *hashTable;
  
  iVar16 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
    hashTable = (U16 *)state;
  }
  else {
    hashTable = (U16 *)0x0;
  }
  if (acceleration < 2) {
    acceleration = 1;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar16 = inputSize + (uint)inputSize / 0xff + 0x10;
  }
  uVar29 = *(uint *)(hashTable + 0x2000);
  lVar9 = (long)source - (ulong)uVar29;
  iVar22 = (int)lVar9;
  sVar3 = (short)lVar9;
  iVar2 = (int)dest;
  if (maxOutputSize < iVar16) {
    pcVar30 = dest + maxOutputSize;
    if (inputSize < 0x1000b) {
      if ((uint)inputSize < 0x7e000001) {
        *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
        *(uint *)(hashTable + 0x2000) = uVar29 + inputSize;
        hashTable[0x2003] = 3;
        piVar21 = (int *)source;
        if ((uint)inputSize < 0xd) {
LAB_0010347d:
          pcVar6 = source + ((long)inputSize - (long)piVar21);
          if (pcVar30 < (char *)((long)dest + (long)(pcVar6 + (ulong)(pcVar6 + 0xf0) / 0xff + 1))) {
            return 0;
          }
          if (pcVar6 < (char *)0xf) {
            *dest = (char)pcVar6 << 4;
          }
          else {
            pcVar30 = pcVar6 + -0xf;
            *dest = -0x10;
            psVar28 = (short *)((long)dest + 1);
            if ((char *)0xfe < pcVar30) {
              uVar7 = (ulong)(pcVar6 + -0x10e) / 0xff;
              memset(psVar28,0xff,uVar7 + 1);
              pcVar30 = pcVar6 + uVar7 * -0xff + -0x10e;
              psVar28 = (short *)((long)dest + uVar7 + 2);
            }
            *(char *)psVar28 = (char)pcVar30;
            dest = (char *)psVar28;
          }
          memcpy((char *)((long)dest + 1),piVar21,(size_t)pcVar6);
          return ((int)(char *)((long)dest + 1) + (int)pcVar6) - iVar2;
        }
        hashTable[(uint)(*(int *)source * -0x61c8864f) >> 0x13] = (U16)uVar29;
        puVar1 = (ulong *)(source + (long)inputSize + -0xc);
        local_b0 = (short *)dest;
LAB_00102c7e:
        iVar25 = 1;
        iVar16 = *(int *)((long)piVar21 + 1);
        piVar14 = (int *)((long)piVar21 + 1);
        iVar22 = acceleration << 6;
        do {
          piVar15 = piVar14;
          piVar14 = (int *)((long)iVar25 + (long)piVar15);
          dest = (char *)local_b0;
          if (source + (long)inputSize + -0xb < piVar14) goto LAB_0010347d;
          iVar25 = iVar22 >> 6;
          iVar22 = iVar22 + 1;
          uVar29 = (uint)(iVar16 * -0x61c8864f) >> 0x13;
          uVar19 = hashTable[uVar29];
          iVar16 = *piVar14;
          hashTable[uVar29] = (short)piVar15 - sVar3;
        } while (*(int *)(lVar9 + (ulong)uVar19) != *piVar15);
        lVar12 = (ulong)uVar19 + lVar9;
        uVar13 = (int)piVar15 - (int)piVar21;
        lVar18 = 0;
        uVar29 = uVar13 - 0xf;
        cVar4 = (char)piVar15 * '\x10' + (char)piVar21 * -0x10;
        do {
          cVar24 = cVar4;
          uVar17 = uVar29;
          lVar27 = lVar18;
          pcVar6 = (char *)(lVar12 + lVar27);
          piVar14 = (int *)((long)piVar15 + lVar27);
          if ((pcVar6 <= source) || (piVar14 <= piVar21)) break;
          lVar18 = lVar27 + -1;
          uVar29 = uVar17 - 1;
          cVar4 = cVar24 + -0x10;
        } while (*(char *)((long)piVar15 + lVar27 + -1) == *(char *)(lVar12 + -1 + lVar27));
        iVar16 = (int)lVar27;
        uVar7 = (ulong)(uint)(((int)piVar15 - (int)piVar21) + iVar16);
        if (pcVar30 < (char *)((long)local_b0 +
                              ((ulong)uVar13 + lVar27 & 0xffffffff) / 0xff + uVar7 + 9)) {
          return 0;
        }
        psVar28 = (short *)((long)local_b0 + 1);
        if ((uint)((ulong)uVar13 + lVar27) < 0xf) {
          *(char *)local_b0 = cVar24;
        }
        else {
          uVar5 = (ulong)(uVar13 - 0xf) + lVar27;
          *(char *)local_b0 = -0x10;
          if (0xfe < (int)uVar5) {
            uVar29 = 0x1fd;
            if (uVar17 < 0x1fd) {
              uVar29 = uVar17;
            }
            if (0x1fc < (int)uVar17) {
              uVar17 = 0x1fd;
            }
            memset(psVar28,0xff,(ulong)((((uVar13 + 0xef) - uVar29) + iVar16) / 0xff + 1));
            uVar29 = ((uVar13 + 0xef) - uVar17) + iVar16;
            psVar28 = (short *)((long)local_b0 + (ulong)uVar29 / 0xff + 2);
            uVar5 = (ulong)((uVar13 - 0x10e) + iVar16 + (uVar29 % 0xff - uVar29));
          }
          *(char *)psVar28 = (char)uVar5;
          psVar28 = (short *)((long)psVar28 + 1);
        }
        psVar34 = (short *)(uVar7 + (long)psVar28);
        do {
          *(undefined8 *)psVar28 = *(undefined8 *)piVar21;
          psVar28 = psVar28 + 4;
          piVar21 = piVar21 + 2;
        } while (psVar28 < psVar34);
        do {
          *psVar34 = (short)piVar14 - (short)pcVar6;
          puVar23 = (ulong *)(piVar14 + 1);
          puVar35 = (ulong *)(pcVar6 + 4);
          puVar32 = puVar23;
          if (puVar23 < puVar1) {
            if (*puVar35 == *puVar23) {
              puVar35 = (ulong *)(pcVar6 + 0xc);
              puVar32 = (ulong *)(piVar14 + 3);
              goto LAB_00102e7f;
            }
            uVar7 = *puVar23 ^ *puVar35;
            lVar18 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            uVar29 = (uint)lVar18 >> 3;
          }
          else {
LAB_00102e7f:
            if (puVar32 < puVar1) {
              iVar16 = ((int)puVar32 - (int)piVar14) + -4;
LAB_00102e8c:
              if (*puVar35 == *puVar32) goto code_r0x00102e98;
              uVar5 = *puVar32 ^ *puVar35;
              uVar7 = 0;
              if (uVar5 != 0) {
                for (; (uVar5 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              uVar29 = ((uint)(uVar7 >> 3) & 0x1fffffff) + iVar16;
              goto LAB_00102f10;
            }
LAB_00102ea8:
            if ((puVar32 < source + (long)inputSize + -8) && ((int)*puVar35 == (int)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 4);
              puVar35 = (ulong *)((long)puVar35 + 4);
            }
            if ((puVar32 < source + (long)inputSize + -6) && ((short)*puVar35 == (short)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 2);
              puVar35 = (ulong *)((long)puVar35 + 2);
            }
            if (puVar32 < source + (long)inputSize + -5) {
              puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar35 == (char)*puVar32));
            }
            uVar29 = (int)puVar32 - (int)puVar23;
          }
LAB_00102f10:
          if (pcVar30 < (char *)((long)psVar34 + (ulong)(uVar29 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          dest = (char *)(psVar34 + 1);
          if (uVar29 < 0xf) {
            *(char *)local_b0 = (char)*local_b0 + (char)uVar29;
          }
          else {
            *(char *)local_b0 = (char)*local_b0 + '\x0f';
            uVar19 = (ushort)(uVar29 - 0xf);
            *(short *)((long)dest + 0) = -1;
            *(short *)((long)dest + 2) = -1;
            if (0x3fb < uVar29 - 0xf) {
              uVar19 = (ushort)((ulong)(uVar29 - 0x40b) % 0x3fc);
              uVar7 = (ulong)((uVar29 - 0x40b) / 0x3fc << 2);
              memset(psVar34 + 3,0xff,uVar7 + 4);
              dest = (char *)((long)psVar34 + uVar7 + 6);
            }
            pcVar6 = (char *)((long)dest + (ulong)(uVar19 / 0xff));
            dest = pcVar6 + 1;
            *pcVar6 = (char)((uint)uVar19 % 0xff);
          }
          lVar18 = (long)piVar14 + (ulong)uVar29;
          piVar14 = (int *)(lVar18 + 4);
          piVar21 = piVar14;
          if (source + (long)inputSize + -0xb <= piVar14) goto LAB_0010347d;
          hashTable[(uint)(*(int *)(lVar18 + 2) * -0x61c8864f) >> 0x13] =
               ((short)lVar18 + 2) - sVar3;
          uVar29 = (uint)(*piVar14 * -0x61c8864f) >> 0x13;
          uVar19 = hashTable[uVar29];
          pcVar6 = (char *)(lVar9 + (ulong)uVar19);
          hashTable[uVar29] = (short)piVar14 - sVar3;
          local_b0 = (short *)dest;
          if (*(int *)(lVar9 + (ulong)uVar19) != *piVar14) goto LAB_00102c7e;
          psVar34 = (short *)((long)dest + 1);
          *dest = '\0';
        } while( true );
      }
    }
    else if ((uint)inputSize < 0x7e000001) {
      *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
      plVar20 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
      *(uint *)(hashTable + 0x2000) = inputSize + uVar29;
      hashTable[0x2003] = 2;
      *(uint *)(hashTable + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 2) = uVar29;
      plVar10 = (long *)(source + 2);
      puVar1 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
      plVar33 = (long *)source;
LAB_00102424:
      lVar18 = *(long *)((long)plVar33 + 1);
      plVar26 = (long *)((long)plVar33 + 1);
      iVar16 = acceleration << 6;
      while( true ) {
        uVar7 = (ulong)(lVar18 * -0x30e4432345000000) >> 0x34;
        uVar29 = *(uint *)(hashTable + uVar7 * 2);
        iVar25 = (int)plVar26;
        lVar18 = *plVar10;
        *(int *)(hashTable + uVar7 * 2) = iVar25 - iVar22;
        if (((uint)(iVar25 - iVar22) <= uVar29 + 0xffff) &&
           (*(int *)(lVar9 + (ulong)uVar29) == (int)*plVar26)) break;
        plVar11 = (long *)((long)(iVar16 >> 6) + (long)plVar10);
        iVar16 = iVar16 + 1;
        plVar26 = plVar10;
        plVar10 = plVar11;
        if (plVar20 < plVar11) goto LAB_001035d5;
      }
      lVar12 = (ulong)uVar29 + lVar9;
      uVar13 = iVar25 - (int)plVar33;
      lVar18 = 0;
      uVar29 = uVar13 - 0xf;
      cVar4 = (char)plVar26 * '\x10' + (char)plVar33 * -0x10;
      do {
        cVar24 = cVar4;
        uVar17 = uVar29;
        lVar27 = lVar18;
        piVar21 = (int *)(lVar12 + lVar27);
        plVar10 = (long *)((long)plVar26 + lVar27);
        if ((piVar21 <= source) || (plVar10 <= plVar33)) break;
        lVar18 = lVar27 + -1;
        uVar29 = uVar17 - 1;
        cVar4 = cVar24 + -0x10;
      } while (*(char *)((long)plVar26 + lVar27 + -1) == *(char *)(lVar12 + -1 + lVar27));
      iVar16 = (int)lVar27;
      uVar7 = (ulong)(uint)(iVar16 + (iVar25 - (int)plVar33));
      if (pcVar30 < dest + ((ulong)uVar13 + lVar27 & 0xffffffff) / 0xff + uVar7 + 9) {
        return 0;
      }
      plVar26 = (long *)(dest + 1);
      if ((uint)((ulong)uVar13 + lVar27) < 0xf) {
        *dest = cVar24;
      }
      else {
        uVar5 = (ulong)(uVar13 - 0xf) + lVar27;
        *dest = -0x10;
        if (0xfe < (int)uVar5) {
          uVar29 = 0x1fd;
          if (uVar17 < 0x1fd) {
            uVar29 = uVar17;
          }
          if (0x1fc < (int)uVar17) {
            uVar17 = 0x1fd;
          }
          memset(plVar26,0xff,(ulong)((((uVar13 + 0xef) - uVar29) + iVar16) / 0xff + 1));
          uVar29 = ((uVar13 + 0xef) - uVar17) + iVar16;
          plVar26 = (long *)(dest + (ulong)uVar29 / 0xff + 2);
          uVar5 = (ulong)((uVar13 - 0x10e) + iVar16 + (uVar29 % 0xff - uVar29));
        }
        *(char *)plVar26 = (char)uVar5;
        plVar26 = (long *)((long)plVar26 + 1);
      }
      plVar11 = (long *)(uVar7 + (long)plVar26);
      do {
        *plVar26 = *plVar33;
        plVar26 = plVar26 + 1;
        plVar33 = plVar33 + 1;
      } while (plVar26 < plVar11);
      do {
        *(short *)plVar11 = (short)plVar10 - (short)piVar21;
        puVar23 = (ulong *)((long)plVar10 + 4);
        puVar35 = (ulong *)(piVar21 + 1);
        puVar32 = puVar23;
        if (puVar23 < puVar1) {
          if (*puVar35 == *puVar23) {
            puVar35 = (ulong *)(piVar21 + 3);
            puVar32 = (ulong *)((long)plVar10 + 0xc);
            goto LAB_00102628;
          }
          uVar7 = *puVar23 ^ *puVar35;
          lVar18 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          uVar29 = (uint)lVar18 >> 3;
        }
        else {
LAB_00102628:
          if (puVar32 < puVar1) {
            iVar16 = ((int)puVar32 - (int)plVar10) + -4;
LAB_00102636:
            if (*puVar35 == *puVar32) goto code_r0x00102641;
            uVar5 = *puVar32 ^ *puVar35;
            uVar7 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            uVar29 = ((uint)(uVar7 >> 3) & 0x1fffffff) + iVar16;
            goto LAB_001026b7;
          }
LAB_00102651:
          if ((puVar32 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar35 == (int)*puVar32))
          {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar35 = (ulong *)((long)puVar35 + 4);
          }
          if ((puVar32 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar35 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar35 = (ulong *)((long)puVar35 + 2);
          }
          if (puVar32 < source + ((ulong)(uint)inputSize - 5)) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar35 == (char)*puVar32));
          }
          uVar29 = (int)puVar32 - (int)puVar23;
        }
LAB_001026b7:
        if (pcVar30 < (char *)((long)plVar11 + (ulong)(uVar29 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        pcVar6 = (char *)((long)plVar11 + 2);
        if (uVar29 < 0xf) {
          *dest = *dest + (char)uVar29;
          dest = pcVar6;
        }
        else {
          *dest = *dest + '\x0f';
          uVar19 = (ushort)(uVar29 - 0xf);
          pcVar6[0] = -1;
          pcVar6[1] = -1;
          pcVar6[2] = -1;
          pcVar6[3] = -1;
          if (0x3fb < uVar29 - 0xf) {
            uVar19 = (ushort)((ulong)(uVar29 - 0x40b) % 0x3fc);
            uVar7 = (ulong)((uVar29 - 0x40b) / 0x3fc << 2);
            memset((char *)((long)plVar11 + 6),0xff,uVar7 + 4);
            pcVar6 = (char *)((long)plVar11 + uVar7 + 6);
          }
          pcVar6[uVar19 / 0xff] = (char)((uint)uVar19 % 0xff);
          dest = pcVar6 + uVar19 / 0xff + 1;
        }
        lVar18 = (long)plVar10 + (ulong)uVar29;
        plVar33 = (long *)(lVar18 + 4);
        if (plVar20 <= plVar33) goto LAB_001035d5;
        *(int *)(hashTable + ((ulong)(*(long *)(lVar18 + 2) * -0x30e4432345000000) >> 0x34) * 2) =
             ((int)lVar18 + 2) - iVar22;
        uVar7 = (ulong)(*plVar33 * -0x30e4432345000000) >> 0x34;
        uVar13 = (int)plVar33 - iVar22;
        uVar29 = *(uint *)(hashTable + uVar7 * 2);
        *(uint *)(hashTable + uVar7 * 2) = uVar13;
        if ((uVar29 + 0xffff < uVar13) ||
           (piVar21 = (int *)((ulong)uVar29 + lVar9), *piVar21 != *(int *)plVar33))
        goto LAB_001027e5;
        plVar11 = (long *)(dest + 1);
        *dest = '\0';
        plVar10 = plVar33;
      } while( true );
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
      *(uint *)(hashTable + 0x2000) = uVar29 + inputSize;
      hashTable[0x2003] = 3;
      local_a8 = (short *)dest;
      piVar21 = (int *)source;
      if ((uint)inputSize < 0xd) {
LAB_001033ec:
        pcVar30 = source + ((long)inputSize - (long)piVar21);
        if (pcVar30 < (char *)0xf) {
          *(char *)local_a8 = (char)pcVar30 << 4;
        }
        else {
          pcVar6 = pcVar30 + -0xf;
          *(char *)local_a8 = -0x10;
          psVar28 = (short *)((long)local_a8 + 1);
          if ((char *)0xfe < pcVar6) {
            uVar7 = (ulong)(pcVar30 + -0x10e) / 0xff;
            memset(psVar28,0xff,uVar7 + 1);
            pcVar6 = pcVar30 + uVar7 * -0xff + -0x10e;
            psVar28 = (short *)((long)local_a8 + uVar7 + 2);
          }
          *(char *)psVar28 = (char)pcVar6;
          local_a8 = psVar28;
        }
        memcpy((char *)((long)local_a8 + 1),piVar21,(size_t)pcVar30);
        return ((int)(char *)((long)local_a8 + 1) + (int)pcVar30) - iVar2;
      }
      hashTable[(uint)(*(int *)source * -0x61c8864f) >> 0x13] = (U16)uVar29;
      puVar1 = (ulong *)(source + (long)inputSize + -0xc);
LAB_00103088:
      iVar16 = *(int *)((long)piVar21 + 1);
      iVar22 = 1;
      piVar14 = (int *)((long)piVar21 + 1);
      iVar25 = acceleration << 6;
      do {
        piVar15 = piVar14;
        piVar14 = (int *)((long)iVar22 + (long)piVar15);
        if (source + (long)inputSize + -0xb < piVar14) goto LAB_001033ec;
        iVar22 = iVar25 >> 6;
        iVar25 = iVar25 + 1;
        uVar29 = (uint)(iVar16 * -0x61c8864f) >> 0x13;
        uVar19 = hashTable[uVar29];
        iVar16 = *piVar14;
        hashTable[uVar29] = (short)piVar15 - sVar3;
      } while (*(int *)(lVar9 + (ulong)uVar19) != *piVar15);
      lVar12 = (ulong)uVar19 + lVar9;
      iVar16 = (int)piVar15 - (int)piVar21;
      lVar18 = 0;
      cVar4 = (char)piVar15 * '\x10' + (char)piVar21 * -0x10;
      uVar29 = iVar16 - 0xfU;
      do {
        uVar13 = uVar29;
        cVar24 = cVar4;
        lVar27 = lVar18;
        pcVar30 = (char *)(lVar12 + lVar27);
        piVar14 = (int *)((long)piVar15 + lVar27);
        if ((pcVar30 <= source) || (piVar14 <= piVar21)) break;
        lVar18 = lVar27 + -1;
        cVar4 = cVar24 + -0x10;
        uVar29 = uVar13 - 1;
      } while (*(char *)((long)piVar15 + lVar27 + -1) == *(char *)(lVar12 + -1 + lVar27));
      iVar22 = (int)lVar27;
      psVar28 = (short *)((long)local_a8 + 1);
      if ((uint)(iVar16 + iVar22) < 0xf) {
        *(char *)local_a8 = cVar24;
      }
      else {
        uVar7 = (ulong)(iVar16 - 0xfU) + lVar27;
        *(char *)local_a8 = -0x10;
        if (0xfe < (int)uVar7) {
          uVar29 = 0x1fd;
          if (uVar13 < 0x1fd) {
            uVar29 = uVar13;
          }
          if (0x1fc < (int)uVar13) {
            uVar13 = 0x1fd;
          }
          memset(psVar28,0xff,(ulong)((((iVar16 + 0xef) - uVar29) + iVar22) / 0xff + 1));
          uVar29 = ((iVar16 + 0xef) - uVar13) + iVar22;
          psVar28 = (short *)((long)local_a8 + (ulong)uVar29 / 0xff + 2);
          uVar7 = (ulong)(iVar16 + -0x10e + iVar22 + (uVar29 % 0xff - uVar29));
        }
        *(char *)psVar28 = (char)uVar7;
        psVar28 = (short *)((long)psVar28 + 1);
      }
      psVar34 = (short *)((ulong)(uint)((int)piVar14 - (int)piVar21) + (long)psVar28);
      do {
        *(undefined8 *)psVar28 = *(undefined8 *)piVar21;
        psVar28 = psVar28 + 4;
        piVar21 = piVar21 + 2;
        psVar31 = local_a8;
      } while (psVar28 < psVar34);
      do {
        *psVar34 = (short)piVar14 - (short)pcVar30;
        local_a8 = psVar34 + 1;
        puVar23 = (ulong *)(piVar14 + 1);
        puVar35 = (ulong *)(pcVar30 + 4);
        puVar32 = puVar23;
        if (puVar23 < puVar1) {
          if (*puVar35 == *puVar23) {
            puVar35 = (ulong *)(pcVar30 + 0xc);
            puVar32 = (ulong *)(piVar14 + 3);
            goto LAB_00103248;
          }
          uVar5 = *puVar23 ^ *puVar35;
          uVar7 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar7 = uVar7 >> 3 & 0x1fffffff;
          piVar14 = (int *)((long)piVar14 + uVar7 + 4);
LAB_0010330f:
          *(char *)psVar31 = (char)*psVar31 + (char)uVar7;
        }
        else {
LAB_00103248:
          if (puVar32 < puVar1) {
LAB_00103256:
            if (*puVar35 == *puVar32) goto code_r0x00103261;
            uVar5 = *puVar32 ^ *puVar35;
            uVar7 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            puVar32 = (ulong *)((long)puVar32 + (uVar7 >> 3 & 0x1fffffff));
            goto LAB_0010329b;
          }
LAB_00103370:
          if ((puVar32 < source + (long)inputSize + -8) && ((int)*puVar35 == (int)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar35 = (ulong *)((long)puVar35 + 4);
          }
          if ((puVar32 < source + (long)inputSize + -6) && ((short)*puVar35 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar35 = (ulong *)((long)puVar35 + 2);
          }
          if (puVar32 < source + (long)inputSize + -5) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar35 == (char)*puVar32));
          }
LAB_0010329b:
          uVar7 = (long)puVar32 - (long)puVar23;
          uVar29 = (uint)uVar7;
          piVar14 = (int *)((long)piVar14 + (uVar7 & 0xffffffff) + 4);
          if (uVar29 < 0xf) goto LAB_0010330f;
          *(char *)psVar31 = (char)*psVar31 + '\x0f';
          uVar13 = uVar29 - 0xf;
          local_a8[0] = -1;
          local_a8[1] = -1;
          if (0x3fb < uVar13) {
            uVar13 = (uVar29 - 0x40b) % 0x3fc;
            uVar7 = (ulong)((uVar29 - 0x40b) / 0x3fc << 2);
            memset(psVar34 + 3,0xff,uVar7 + 4);
            local_a8 = (short *)((long)psVar34 + uVar7 + 6);
          }
          pcVar30 = (char *)((long)local_a8 + (ulong)(ushort)((uVar13 & 0xffff) / 0xff));
          local_a8 = (short *)(pcVar30 + 1);
          *pcVar30 = (char)((uVar13 & 0xffff) % 0xff);
        }
        piVar21 = piVar14;
        if (source + (long)inputSize + -0xb <= piVar14) goto LAB_001033ec;
        hashTable[(uint)(*(int *)((long)piVar14 + -2) * -0x61c8864f) >> 0x13] =
             ((short)piVar14 + -2) - sVar3;
        uVar29 = (uint)(*piVar14 * -0x61c8864f) >> 0x13;
        uVar19 = hashTable[uVar29];
        pcVar30 = (char *)(lVar9 + (ulong)uVar19);
        hashTable[uVar29] = (short)piVar14 - sVar3;
        if (*(int *)(lVar9 + (ulong)uVar19) != *piVar14) goto LAB_00103088;
        psVar34 = (short *)((long)local_a8 + 1);
        *(char *)local_a8 = '\0';
        psVar31 = local_a8;
      } while( true );
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    *(int *)(hashTable + 0x200c) = *(int *)(hashTable + 0x200c) + inputSize;
    plVar20 = (long *)(source + ((ulong)(uint)inputSize - 0xb));
    *(uint *)(hashTable + 0x2000) = inputSize + uVar29;
    hashTable[0x2003] = 2;
    *(uint *)(hashTable + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 2) = uVar29;
    plVar10 = (long *)(source + 2);
    plVar33 = (long *)source;
LAB_001028b0:
    lVar18 = *(long *)((long)plVar33 + 1);
    plVar26 = (long *)((long)plVar33 + 1);
    iVar16 = acceleration << 6;
    while( true ) {
      uVar7 = (ulong)(lVar18 * -0x30e4432345000000) >> 0x34;
      uVar29 = *(uint *)(hashTable + uVar7 * 2);
      uVar13 = (int)plVar26 - iVar22;
      lVar18 = *plVar10;
      *(uint *)(hashTable + uVar7 * 2) = uVar13;
      if ((uVar13 <= uVar29 + 0xffff) && (*(int *)(lVar9 + (ulong)uVar29) == (int)*plVar26)) break;
      plVar11 = (long *)((long)(iVar16 >> 6) + (long)plVar10);
      iVar16 = iVar16 + 1;
      plVar26 = plVar10;
      plVar10 = plVar11;
      if (plVar20 < plVar11) goto LAB_00103542;
    }
    lVar12 = (ulong)uVar29 + lVar9;
    iVar16 = (int)plVar26 - (int)plVar33;
    lVar18 = 0;
    cVar4 = (char)plVar26 * '\x10' + (char)plVar33 * -0x10;
    uVar29 = iVar16 - 0xfU;
    do {
      uVar13 = uVar29;
      cVar24 = cVar4;
      lVar27 = lVar18;
      piVar21 = (int *)(lVar12 + lVar27);
      plVar10 = (long *)((long)plVar26 + lVar27);
      if ((piVar21 <= source) || (plVar10 <= plVar33)) break;
      lVar18 = lVar27 + -1;
      cVar4 = cVar24 + -0x10;
      uVar29 = uVar13 - 1;
    } while (*(char *)((long)plVar26 + lVar27 + -1) == *(char *)(lVar12 + -1 + lVar27));
    iVar25 = (int)lVar27;
    plVar26 = (long *)(dest + 1);
    if ((uint)(iVar16 + iVar25) < 0xf) {
      *dest = cVar24;
    }
    else {
      uVar7 = (ulong)(iVar16 - 0xfU) + lVar27;
      *dest = -0x10;
      if (0xfe < (int)uVar7) {
        uVar29 = 0x1fd;
        if (uVar13 < 0x1fd) {
          uVar29 = uVar13;
        }
        if (0x1fc < (int)uVar13) {
          uVar13 = 0x1fd;
        }
        memset(plVar26,0xff,(ulong)((((iVar16 + 0xef) - uVar29) + iVar25) / 0xff + 1));
        uVar29 = ((iVar16 + 0xef) - uVar13) + iVar25;
        plVar26 = (long *)(dest + (ulong)uVar29 / 0xff + 2);
        uVar7 = (ulong)(iVar16 + -0x10e + iVar25 + (uVar29 % 0xff - uVar29));
      }
      *(char *)plVar26 = (char)uVar7;
      plVar26 = (long *)((long)plVar26 + 1);
    }
    plVar11 = (long *)((ulong)(uint)((int)plVar10 - (int)plVar33) + (long)plVar26);
    do {
      *plVar26 = *plVar33;
      plVar26 = plVar26 + 1;
      plVar33 = plVar33 + 1;
    } while (plVar26 < plVar11);
    do {
      *(short *)plVar11 = (short)plVar10 - (short)piVar21;
      pcVar30 = (char *)((long)plVar11 + 2);
      puVar1 = (ulong *)((long)plVar10 + 4);
      puVar23 = (ulong *)(piVar21 + 1);
      puVar35 = puVar1;
      if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
        if (*puVar23 == *puVar1) {
          puVar23 = (ulong *)(piVar21 + 3);
          puVar35 = (ulong *)((long)plVar10 + 0xc);
          goto LAB_00102a8a;
        }
        uVar5 = *puVar1 ^ *puVar23;
        uVar7 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar7 = uVar7 >> 3 & 0x1fffffff;
        plVar33 = (long *)((long)plVar10 + uVar7 + 4);
LAB_00102b55:
        *dest = *dest + (char)uVar7;
        dest = pcVar30;
      }
      else {
LAB_00102a8a:
        if (puVar35 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar23 == *puVar35) goto code_r0x00102a9e;
          uVar5 = *puVar35 ^ *puVar23;
          uVar7 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          puVar35 = (ulong *)((long)puVar35 + (uVar7 >> 3 & 0x1fffffff));
        }
        else {
          if ((puVar35 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar23 == (int)*puVar35))
          {
            puVar35 = (ulong *)((long)puVar35 + 4);
            puVar23 = (ulong *)((long)puVar23 + 4);
          }
          if ((puVar35 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar23 == (short)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 2);
            puVar23 = (ulong *)((long)puVar23 + 2);
          }
          if (puVar35 < source + ((ulong)(uint)inputSize - 5)) {
            puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar23 == (char)*puVar35));
          }
        }
        uVar7 = (long)puVar35 - (long)puVar1;
        uVar29 = (uint)uVar7;
        plVar33 = (long *)((long)plVar10 + (uVar7 & 0xffffffff) + 4);
        if (uVar29 < 0xf) goto LAB_00102b55;
        *dest = *dest + '\x0f';
        uVar13 = uVar29 - 0xf;
        pcVar30[0] = -1;
        pcVar30[1] = -1;
        pcVar30[2] = -1;
        pcVar30[3] = -1;
        if (0x3fb < uVar13) {
          uVar13 = (uVar29 - 0x40b) % 0x3fc;
          uVar7 = (ulong)((uVar29 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)plVar11 + 6),0xff,uVar7 + 4);
          pcVar30 = (char *)((long)plVar11 + uVar7 + 6);
        }
        pcVar30[(ushort)((uVar13 & 0xffff) / 0xff)] = (char)((uVar13 & 0xffff) % 0xff);
        dest = pcVar30 + (ushort)((uVar13 & 0xffff) / 0xff) + 1;
      }
      if (plVar20 <= plVar33) goto LAB_00103542;
      *(int *)(hashTable +
              ((ulong)(*(long *)((long)plVar33 + -2) * -0x30e4432345000000) >> 0x34) * 2) =
           ((int)plVar33 + -2) - iVar22;
      uVar7 = (ulong)(*plVar33 * -0x30e4432345000000) >> 0x34;
      uVar13 = (int)plVar33 - iVar22;
      uVar29 = *(uint *)(hashTable + uVar7 * 2);
      *(uint *)(hashTable + uVar7 * 2) = uVar13;
      if ((uVar29 + 0xffff < uVar13) ||
         (piVar21 = (int *)((ulong)uVar29 + lVar9), *piVar21 != (int)*plVar33)) goto LAB_00102c12;
      plVar11 = (long *)(dest + 1);
      *dest = '\0';
      plVar10 = plVar33;
    } while( true );
  }
  return 0;
code_r0x00102a9e:
  puVar23 = puVar23 + 1;
  puVar35 = puVar35 + 1;
  goto LAB_00102a8a;
LAB_00102c12:
  plVar10 = (long *)((long)plVar33 + 2);
  if (plVar20 < plVar10) {
LAB_00103542:
    pcVar30 = source + ((ulong)(uint)inputSize - (long)plVar33);
    if (pcVar30 < (char *)0xf) {
      *dest = (char)pcVar30 << 4;
    }
    else {
      pcVar6 = pcVar30 + -0xf;
      *dest = -0x10;
      pcVar8 = dest + 1;
      if ((char *)0xfe < pcVar6) {
        uVar7 = (ulong)(pcVar30 + -0x10e) / 0xff;
        memset(pcVar8,0xff,uVar7 + 1);
        pcVar6 = pcVar30 + uVar7 * -0xff + -0x10e;
        pcVar8 = dest + uVar7 + 2;
      }
      *pcVar8 = (char)pcVar6;
      dest = pcVar8;
    }
    memcpy(dest + 1,plVar33,(size_t)pcVar30);
    return ((int)(dest + 1) + (int)pcVar30) - iVar2;
  }
  goto LAB_001028b0;
code_r0x00103261:
  puVar32 = puVar32 + 1;
  puVar35 = puVar35 + 1;
  if (puVar1 <= puVar32) goto LAB_00103370;
  goto LAB_00103256;
code_r0x00102641:
  puVar32 = puVar32 + 1;
  puVar35 = puVar35 + 1;
  iVar16 = iVar16 + 8;
  if (puVar1 <= puVar32) goto LAB_00102651;
  goto LAB_00102636;
LAB_001027e5:
  plVar10 = (long *)(lVar18 + 6);
  if (plVar20 < plVar10) {
LAB_001035d5:
    pcVar6 = source + ((ulong)(uint)inputSize - (long)plVar33);
    iVar16 = 0;
    if (dest + (long)(pcVar6 + (ulong)(pcVar6 + 0xf0) / 0xff + 1) <= pcVar30) {
      if (pcVar6 < (char *)0xf) {
        *dest = (char)pcVar6 << 4;
      }
      else {
        pcVar8 = pcVar6 + -0xf;
        *dest = -0x10;
        pcVar30 = dest + 1;
        if ((char *)0xfe < pcVar8) {
          uVar7 = (ulong)(pcVar6 + -0x10e) / 0xff;
          memset(pcVar30,0xff,uVar7 + 1);
          pcVar8 = pcVar6 + uVar7 * -0xff + -0x10e;
          pcVar30 = dest + uVar7 + 2;
        }
        *pcVar30 = (char)pcVar8;
        dest = pcVar30;
      }
      memcpy(dest + 1,plVar33,(size_t)pcVar6);
      iVar16 = ((int)(dest + 1) + (int)pcVar6) - iVar2;
    }
    return iVar16;
  }
  goto LAB_00102424;
code_r0x00102e98:
  puVar32 = puVar32 + 1;
  puVar35 = puVar35 + 1;
  iVar16 = iVar16 + 8;
  if (puVar1 <= puVar32) goto LAB_00102ea8;
  goto LAB_00102e8c;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}